

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# except.cc
# Opt level: O0

void __thiscall
kratos::GeneratorException::GeneratorException
          (GeneratorException *this,string *message,
          vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *nodes)

{
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *nodes_local;
  string *message_local;
  GeneratorException *this_local;
  
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)message);
  *(undefined ***)this = &PTR__GeneratorException_0058a020;
  print_nodes<kratos::IRNode*>(nodes);
  return;
}

Assistant:

GeneratorException::GeneratorException(const std::string& message,
                                       const std::vector<IRNode*>& nodes) noexcept
    : std::runtime_error(message) {
    print_nodes(nodes);
}